

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparserutils.h
# Opt level: O3

bool lunasvg::isIntegralDigit(char ch,int base)

{
  undefined3 in_register_00000039;
  uint uVar1;
  
  uVar1 = CONCAT31(in_register_00000039,ch);
  if (uVar1 - 0x30 < 10) {
    return (int)(uVar1 - 0x30) < base;
  }
  if ((uVar1 & 0xffffffdf) - 0x41 < 0x1a) {
    if ('`' < ch && (int)uVar1 < base + 0x57) {
      return true;
    }
    if ('@' < ch) {
      return (int)uVar1 < base + 0x37;
    }
  }
  return false;
}

Assistant:

constexpr bool IS_NUM(int cc) { return cc >= '0' && cc <= '9'; }